

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t __thiscall
GEO::PeriodicDelaunay3dThread::new_tetrahedron
          (PeriodicDelaunay3dThread *this,signed_index_t v1,signed_index_t v2,signed_index_t v3,
          signed_index_t v4)

{
  pointer piVar1;
  index_t iVar2;
  ulong uVar3;
  
  iVar2 = new_tetrahedron(this);
  uVar3 = (ulong)(iVar2 * 4);
  piVar1 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1[uVar3] = v1;
  piVar1[uVar3 + 1] = v2;
  piVar1[uVar3 + 2] = v3;
  piVar1[uVar3 + 3] = v4;
  return iVar2;
}

Assistant:

index_t new_tetrahedron(
            signed_index_t v1, signed_index_t v2, 
            signed_index_t v3, signed_index_t v4
        ) {
            index_t result = new_tetrahedron();
            cell_to_v_store_[4 * result] = v1;
            cell_to_v_store_[4 * result + 1] = v2;
            cell_to_v_store_[4 * result + 2] = v3;
            cell_to_v_store_[4 * result + 3] = v4;
            return result;
        }